

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mc_lexer.yy.cc
# Opt level: O0

yy_state_type __thiscall
yyFlexLexer::yy_try_NUL_trans(yyFlexLexer *this,yy_state_type yy_current_state)

{
  int local_34;
  byte local_21;
  YY_CHAR yy_c;
  char *yy_cp;
  int yy_is_jam;
  yy_state_type yy_current_state_local;
  yyFlexLexer *this_local;
  
  local_21 = 1;
  yy_cp._4_4_ = yy_current_state;
  if (yy_accept[yy_current_state] != 0) {
    this->yy_last_accepting_state = yy_current_state;
    this->yy_last_accepting_cpos = this->yy_c_buf_p;
  }
  while (yy_chk[(int)((int)yy_base[yy_cp._4_4_] + (uint)local_21)] != yy_cp._4_4_) {
    yy_cp._4_4_ = (yy_state_type)yy_def[yy_cp._4_4_];
    if (0x436 < yy_cp._4_4_) {
      local_21 = ""[local_21];
    }
  }
  local_34 = (int)yy_nxt[(int)((int)yy_base[yy_cp._4_4_] + (uint)local_21)];
  if (local_34 == 0x436) {
    local_34 = 0;
  }
  return local_34;
}

Assistant:

yy_state_type yyFlexLexer::yy_try_NUL_trans( yy_state_type yy_current_state )
/* %endif */
{
	int yy_is_jam;
    /* %% [17.0] code to find the next state, and perhaps do backing up, goes here */
	char *yy_cp = (yy_c_buf_p);

	YY_CHAR yy_c = 1;
	if ( yy_accept[yy_current_state] )
		{
		(yy_last_accepting_state) = yy_current_state;
		(yy_last_accepting_cpos) = yy_cp;
		}
	while ( yy_chk[yy_base[yy_current_state] + yy_c] != yy_current_state )
		{
		yy_current_state = (int) yy_def[yy_current_state];
		if ( yy_current_state >= 1079 )
			yy_c = yy_meta[yy_c];
		}
	yy_current_state = yy_nxt[yy_base[yy_current_state] + yy_c];
	yy_is_jam = (yy_current_state == 1078);

		return yy_is_jam ? 0 : yy_current_state;
}